

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_delete_extver_tab(void)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0x170;
  if ((ngp_extver_tab != (NGP_EXTVER_TAB *)0x0 || ngp_extver_tab_size < 1) &&
     (ngp_extver_tab == (NGP_EXTVER_TAB *)0x0 || 0 < ngp_extver_tab_size)) {
    iVar1 = 0;
    if (ngp_extver_tab != (NGP_EXTVER_TAB *)0x0 || ngp_extver_tab_size != 0) {
      if (0 < ngp_extver_tab_size) {
        lVar2 = 0;
        lVar3 = 0;
        do {
          __ptr = *(void **)((long)&ngp_extver_tab->extname + lVar2);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            *(undefined8 *)((long)&ngp_extver_tab->extname + lVar2) = 0;
          }
          *(undefined4 *)((long)&ngp_extver_tab->version + lVar2) = 0;
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + 0x10;
        } while (lVar3 < ngp_extver_tab_size);
      }
      free(ngp_extver_tab);
      ngp_extver_tab = (NGP_EXTVER_TAB *)0x0;
      ngp_extver_tab_size = 0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int	ngp_delete_extver_tab(void)
 { int i;

   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (0 == ngp_extver_tab_size)) return(NGP_OK);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (NULL != ngp_extver_tab[i].extname)
        { ngp_free(ngp_extver_tab[i].extname);
          ngp_extver_tab[i].extname = NULL;
        }
      ngp_extver_tab[i].version = 0;
    }
   ngp_free(ngp_extver_tab);
   ngp_extver_tab = NULL;
   ngp_extver_tab_size = 0;
   return(NGP_OK);
 }